

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

StringView __thiscall anon_unknown.dwarf_550beb::Db::parseBareSourceName(Db *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  StringView SVar4;
  size_t Int;
  size_t local_10;
  
  local_10 = 0;
  bVar1 = parsePositiveInteger(this,&local_10);
  if (!bVar1) {
    pcVar2 = this->First;
    if (local_10 <= (ulong)((long)this->Last - (long)pcVar2)) {
      pcVar3 = pcVar2 + local_10;
      this->First = pcVar3;
      goto LAB_001bf4d9;
    }
  }
  pcVar2 = (char *)0x0;
  pcVar3 = (char *)0x0;
LAB_001bf4d9:
  SVar4.Last = pcVar3;
  SVar4.First = pcVar2;
  return SVar4;
}

Assistant:

StringView Db::parseBareSourceName() {
  size_t Int = 0;
  if (parsePositiveInteger(&Int) || numLeft() < Int)
    return StringView();
  StringView R(First, First + Int);
  First += Int;
  return R;
}